

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_resume(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  CURLcode CVar6;
  curl_off_t cVar7;
  long lVar8;
  
  CVar6 = CURLE_OK;
  if ((httpreq != HTTPREQ_PUT) && (httpreq != HTTPREQ_POST)) {
    return CURLE_OK;
  }
  lVar8 = (data->state).resume_from;
  if (lVar8 == 0) {
    return CURLE_OK;
  }
  if (lVar8 < 0) {
    (data->state).resume_from = 0;
    return CURLE_OK;
  }
  if (((data->state).field_0x6d0 & 2) != 0) {
    return CURLE_OK;
  }
  if (conn->seek_func != (curl_seek_callback)0x0) {
    Curl_set_in_callback(data,true);
    iVar2 = (*conn->seek_func)(conn->seek_client,(data->state).resume_from,0);
    Curl_set_in_callback(data,false);
    if (iVar2 == 0) goto LAB_005c51f5;
    if (iVar2 != 2) {
      Curl_failf(data,"Could not seek stream");
      return CURLE_READ_ERROR;
    }
  }
  cVar7 = (data->state).resume_from;
  lVar8 = 0;
  do {
    sVar3 = (size_t)(data->set).buffer_size;
    if (cVar7 - lVar8 <= (long)sVar3) {
      sVar3 = curlx_sotouz(cVar7 - lVar8);
    }
    sVar4 = (*(data->state).fread_func)((data->state).buffer,1,sVar3,(data->state).in);
    lVar8 = lVar8 + sVar4;
    if (sVar3 <= sVar4 - 1) {
      Curl_failf(data,"Could only read %ld bytes from the input",lVar8);
      return CURLE_READ_ERROR;
    }
    cVar7 = (data->state).resume_from;
  } while (lVar8 < cVar7);
LAB_005c51f5:
  lVar8 = (data->state).infilesize;
  if ((0 < lVar8) &&
     (lVar1 = (data->state).resume_from, lVar5 = lVar8 - lVar1, (data->state).infilesize = lVar5,
     lVar5 == 0 || lVar8 < lVar1)) {
    Curl_failf(data,"File already completely uploaded");
    CVar6 = CURLE_PARTIAL_FILE;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_http_resume(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_HttpReq httpreq)
{
  if((HTTPREQ_POST == httpreq || HTTPREQ_PUT == httpreq) &&
     data->state.resume_from) {
    /**********************************************************************
     * Resuming upload in HTTP means that we PUT or POST and that we have
     * got a resume_from value set. The resume value has already created
     * a Range: header that will be passed along. We need to "fast forward"
     * the file the given number of bytes and decrease the assume upload
     * file size before we continue this venture in the dark lands of HTTP.
     * Resuming mime/form posting at an offset > 0 has no sense and is ignored.
     *********************************************************************/

    if(data->state.resume_from < 0) {
      /*
       * This is meant to get the size of the present remote-file by itself.
       * We don't support this now. Bail out!
       */
      data->state.resume_from = 0;
    }

    if(data->state.resume_from && !data->state.this_is_a_follow) {
      /* do we still game? */

      /* Now, let's read off the proper amount of bytes from the
         input. */
      int seekerr = CURL_SEEKFUNC_CANTSEEK;
      if(conn->seek_func) {
        Curl_set_in_callback(data, true);
        seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                  SEEK_SET);
        Curl_set_in_callback(data, false);
      }

      if(seekerr != CURL_SEEKFUNC_OK) {
        curl_off_t passed = 0;

        if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
          failf(data, "Could not seek stream");
          return CURLE_READ_ERROR;
        }
        /* when seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
        do {
          size_t readthisamountnow =
            (data->state.resume_from - passed > data->set.buffer_size) ?
            (size_t)data->set.buffer_size :
            curlx_sotouz(data->state.resume_from - passed);

          size_t actuallyread =
            data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                   data->state.in);

          passed += actuallyread;
          if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
            /* this checks for greater-than only to make sure that the
               CURL_READFUNC_ABORT return code still aborts */
            failf(data, "Could only read %" CURL_FORMAT_CURL_OFF_T
                  " bytes from the input", passed);
            return CURLE_READ_ERROR;
          }
        } while(passed < data->state.resume_from);
      }

      /* now, decrease the size of the read */
      if(data->state.infilesize>0) {
        data->state.infilesize -= data->state.resume_from;

        if(data->state.infilesize <= 0) {
          failf(data, "File already completely uploaded");
          return CURLE_PARTIAL_FILE;
        }
      }
      /* we've passed, proceed as normal */
    }
  }
  return CURLE_OK;
}